

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pSVar4;
  pointer pnVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  SPxId SVar15;
  DataKey DVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if (pSVar3->thePricing == PARTIAL) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems._24_5_ = 0;
    local_128.data._M_elems[7]._1_3_ = 0;
    local_128.data._M_elems._32_5_ = 0;
    local_128.data._M_elems[9]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    local_a8.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 8);
    local_a8.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    local_a8.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    local_a8.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 6);
    local_a8.exp = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thetolerance.m_backend.exp;
    local_a8.neg = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thetolerance.m_backend.neg;
    local_a8.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_a8.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_a8.fpclass != cpp_dec_float_finite || local_a8.data._M_elems[0] != 0) {
      local_a8.neg = (bool)(local_a8.neg ^ 1);
    }
    iVar13 = this->last;
    lVar21 = (long)this->used;
    if (0 < lVar21) {
      lVar19 = lVar21 + 1;
      lVar21 = lVar21 << 6;
      do {
        iVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::number(&((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver)->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ,(SPxId *)((long)&(this->pricSet).data.
                                            super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].test.
                                            m_backend + lVar21 + -8));
        pSVar3 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pSVar4 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pSVar3->theRep * *(int *)((long)&pSVar4[-1].test.m_backend + lVar21 + -8) < 1) {
          pnVar5 = (pSVar3->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = *(undefined8 *)((long)&pnVar5[iVar10].m_backend.data + 0x20);
          local_128.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_128.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar10].m_backend.data;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[iVar10].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar5[iVar10].m_backend.data + 0x10);
          local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar8 = *(undefined8 *)(puVar1 + 2);
          local_128.data._M_elems._24_5_ = SUB85(uVar8,0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
          local_128.exp = pnVar5[iVar10].m_backend.exp;
          local_128.neg = pnVar5[iVar10].m_backend.neg;
          local_128.fpclass = pnVar5[iVar10].m_backend.fpclass;
          local_128.prec_elem = pnVar5[iVar10].m_backend.prec_elem;
          *(undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x20) = uVar6;
          puVar1 = (uint *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x10);
          *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = uVar8;
          puVar1 = (uint *)((long)&pSVar4[-1].test.m_backend + lVar21);
          *(undefined8 *)puVar1 = local_128.data._M_elems._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._8_8_;
          *(int *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x28) = local_128.exp;
          *(bool *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x2c) = local_128.neg;
          *(undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x30) = local_128._48_8_;
        }
        else {
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::computePvec(&local_68,pSVar3,iVar10);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::computeTest(&local_68,
                        (this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver,iVar10);
          local_128.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
          local_128.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
          local_128.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
          local_128.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
          local_128.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
          local_128.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
          local_128.exp = local_68.m_backend.exp;
          local_128.neg = local_68.m_backend.neg;
          local_128.fpclass = local_68.m_backend.fpclass;
          local_128.prec_elem = local_68.m_backend.prec_elem;
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x20) =
               local_68.m_backend.data._M_elems._32_8_;
          puVar1 = (uint *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x10);
          *(undefined8 *)puVar1 = local_68.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = local_68.m_backend.data._M_elems._24_8_;
          puVar1 = (uint *)((long)&pSVar4[-1].test.m_backend + lVar21);
          *(undefined8 *)puVar1 = local_68.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_68.m_backend.data._M_elems._8_8_;
          *(int *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x28) = local_68.m_backend.exp;
          *(bool *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x2c) = local_68.m_backend.neg;
          *(undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x30) =
               local_68.m_backend._48_8_;
        }
        if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_128,&local_a8), -1 < iVar10)) {
          lVar14 = (long)this->used + -1;
          this->used = (int)lVar14;
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(DataKey *)((long)&pSVar4[-1].test.m_backend + lVar21 + -8) =
               pSVar4[lVar14].id.super_DataKey;
          uVar6 = *(undefined8 *)((long)&pSVar4[lVar14].test.m_backend + 8);
          puVar1 = (uint *)((long)&pSVar4[lVar14].test.m_backend + 0x10);
          uVar8 = *(undefined8 *)puVar1;
          uVar9 = *(undefined8 *)(puVar1 + 2);
          puVar2 = (undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21);
          *puVar2 = *(undefined8 *)&pSVar4[lVar14].test.m_backend;
          puVar2[1] = uVar6;
          puVar2 = (undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x10);
          *puVar2 = uVar8;
          puVar2[1] = uVar9;
          *(undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x20) =
               *(undefined8 *)((long)&pSVar4[lVar14].test.m_backend + 0x20);
          *(int *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x28) =
               *(int *)((long)&pSVar4[lVar14].test.m_backend + 0x28);
          *(bool *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x2c) =
               *(bool *)((long)&pSVar4[lVar14].test.m_backend + 0x2c);
          *(undefined8 *)((long)&pSVar4[-1].test.m_backend + lVar21 + 0x30) =
               *(undefined8 *)((long)&pSVar4[lVar14].test.m_backend + 0x30);
        }
        lVar19 = lVar19 + -1;
        lVar21 = lVar21 + -0x40;
      } while (1 < lVar19);
    }
    while ((int)((ulong)((long)(this->pricSet).data.
                               super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->pricSet).data.
                              super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6) - this->used <
           this->partialSize) {
      iVar10 = this->used;
      if (iVar10 < 2) {
        lVar21 = 0;
      }
      else {
        iVar12 = 0;
        lVar21 = 1;
        lVar19 = 0x48;
        do {
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = iVar12;
          if ((*(int *)((long)&(pSVar4->test).m_backend + lVar19 + 0x28U) != 2) &&
             (*(fpclass_type *)((long)&pSVar4[iVar12].test.m_backend + 0x30) != cpp_dec_float_NaN))
          {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)&(pSVar4->test).m_backend + lVar19 + -8),
                                &pSVar4[iVar12].test.m_backend);
            iVar10 = (int)lVar21;
            if (iVar11 < 1) {
              iVar10 = iVar12;
            }
          }
          iVar12 = iVar10;
          lVar21 = lVar21 + 1;
          iVar10 = this->used;
          lVar19 = lVar19 + 0x40;
        } while (lVar21 < iVar10);
        lVar21 = (long)iVar12;
      }
      this->used = iVar10 + -1;
      pSVar4 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar4[lVar21].id.super_DataKey = pSVar4[(long)iVar10 + -1].id.super_DataKey;
      uVar6 = *(undefined8 *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 8);
      uVar8 = *(undefined8 *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 0x10);
      uVar9 = *(undefined8 *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 0x18);
      *(undefined8 *)&pSVar4[lVar21].test.m_backend =
           *(undefined8 *)&pSVar4[(long)iVar10 + -1].test.m_backend;
      *(undefined8 *)((long)&pSVar4[lVar21].test.m_backend + 8) = uVar6;
      puVar1 = (uint *)((long)&pSVar4[lVar21].test.m_backend + 0x10);
      *(undefined8 *)puVar1 = uVar8;
      *(undefined8 *)(puVar1 + 2) = uVar9;
      *(undefined8 *)((long)&pSVar4[lVar21].test.m_backend + 0x20) =
           *(undefined8 *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 0x20);
      *(int *)((long)&pSVar4[lVar21].test.m_backend + 0x28) =
           *(int *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 0x28);
      *(bool *)((long)&pSVar4[lVar21].test.m_backend + 0x2c) =
           *(bool *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 0x2c);
      *(undefined8 *)((long)&pSVar4[lVar21].test.m_backend + 0x30) =
           *(undefined8 *)((long)&pSVar4[(long)iVar10 + -1].test.m_backend + 0x30);
    }
    do {
      uVar18 = (this->last + 1) % this->multiParts;
      this->last = uVar18;
      for (iVar10 = ~uVar18 + (((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver)->thevectors->set).thenum; -1 < iVar10;
          iVar10 = iVar10 - this->multiParts) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computePvec(&local_68,
                      (this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver,iVar10);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computeTest(&local_68,
                      (this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver,iVar10);
        local_e8.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
        local_e8.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
        local_e8.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
        local_e8.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
        local_e8.exp = local_68.m_backend.exp;
        local_e8.neg = local_68.m_backend.neg;
        local_e8.fpclass = local_68.m_backend.fpclass;
        local_e8.prec_elem = local_68.m_backend.prec_elem;
        if (((local_68.m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_e8,&local_a8), iVar12 < 0)) {
          SVar15 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::id((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver,iVar10);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar15.super_DataKey;
          iVar12 = this->used;
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&pSVar4[iVar12].test.m_backend + 0x20) =
               CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
          puVar1 = (uint *)((long)&pSVar4[iVar12].test.m_backend + 0x10);
          *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
          *(undefined8 *)&pSVar4[iVar12].test.m_backend = local_e8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pSVar4[iVar12].test.m_backend + 8) = local_e8.data._M_elems._8_8_;
          *(int *)((long)&pSVar4[iVar12].test.m_backend + 0x28) = local_e8.exp;
          *(bool *)((long)&pSVar4[iVar12].test.m_backend + 0x2c) = local_e8.neg;
          *(undefined8 *)((long)&pSVar4[iVar12].test.m_backend + 0x30) = local_e8._48_8_;
          this->used = this->used + 1;
        }
      }
      for (uVar18 = ~this->last +
                    (((this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->thecovectors->set).thenum; -1 < (int)uVar18;
          uVar18 = uVar18 - this->multiParts) {
        pnVar5 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&pnVar5[uVar18].m_backend.data + 0x20);
        local_e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_e8.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[uVar18].m_backend.data;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[uVar18].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[uVar18].m_backend.data + 0x10);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        local_e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_e8.exp = pnVar5[uVar18].m_backend.exp;
        local_e8.neg = pnVar5[uVar18].m_backend.neg;
        local_e8.fpclass = pnVar5[uVar18].m_backend.fpclass;
        local_e8.prec_elem = pnVar5[uVar18].m_backend.prec_elem;
        if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_e8,&local_a8), iVar10 < 0)) {
          SVar15 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::coId((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,uVar18);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar15.super_DataKey;
          iVar10 = this->used;
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&pSVar4[iVar10].test.m_backend + 0x20) =
               CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
          puVar1 = (uint *)((long)&pSVar4[iVar10].test.m_backend + 0x10);
          *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
          *(undefined8 *)&pSVar4[iVar10].test.m_backend = local_e8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pSVar4[iVar10].test.m_backend + 8) = local_e8.data._M_elems._8_8_;
          *(int *)((long)&pSVar4[iVar10].test.m_backend + 0x28) = local_e8.exp;
          *(bool *)((long)&pSVar4[iVar10].test.m_backend + 0x2c) = local_e8.neg;
          *(undefined8 *)((long)&pSVar4[iVar10].test.m_backend + 0x30) = local_e8._48_8_;
          this->used = this->used + 1;
        }
      }
      iVar10 = this->used;
    } while ((iVar10 < this->min) && (this->last != iVar13));
    if (iVar10 < 1) {
      DVar16.info = 0;
      DVar16.idx = 0;
      uVar20 = 0xffffffff;
    }
    else {
      iVar13 = iVar10 + 1;
      if (this->partialSize <= iVar10 + 1) {
        iVar13 = this->partialSize;
      }
      this->min = iVar13;
      uVar20 = 0;
      if (1 < this->used) {
        lVar19 = 1;
        lVar21 = 0x48;
        do {
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)&(pSVar4->test).m_backend + lVar21 + 0x28U) != 2) {
            uVar18 = (uint)uVar20;
            if (*(fpclass_type *)((long)&pSVar4[(int)uVar18].test.m_backend + 0x30) !=
                cpp_dec_float_NaN) {
              iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)&(pSVar4->test).m_backend + lVar21 + -8),
                                  &pSVar4[(int)uVar18].test.m_backend);
              uVar17 = (uint)lVar19;
              if (-1 < iVar13) {
                uVar17 = uVar18;
              }
              uVar20 = (ulong)uVar17;
            }
          }
          lVar19 = lVar19 + 1;
          lVar21 = lVar21 + 0x40;
        } while (lVar19 < this->used);
        uVar20 = (ulong)(int)uVar20;
      }
      DVar16 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar20].id.super_DataKey;
      uVar20 = (ulong)DVar16 >> 0x20;
    }
  }
  else {
    uVar6 = *(undefined8 *)
             ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.data._M_elems + 8);
    local_128.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_128.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    local_128.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    local_128.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    uVar6 = *(undefined8 *)
             ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.data._M_elems + 6);
    local_128.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_128.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    local_128.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    local_128.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_128.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_128.fpclass != cpp_dec_float_finite || local_128.data._M_elems[0] != 0) {
      local_128.neg = (bool)(local_128.neg ^ 1);
    }
    lVar21 = (long)(pSVar3->thecovectors->set).thenum;
    if (lVar21 < 1) {
      DVar16.info = 0;
      DVar16.idx = 0;
      uVar20 = 0xffffffff;
    }
    else {
      lVar19 = lVar21 * 0x38 + -8;
      uVar20 = 0xffffffff;
      DVar16.info = 0;
      DVar16.idx = 0;
      do {
        pnVar5 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + -0x10);
        local_e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x30);
        local_e8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x20);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        local_e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_e8.exp = *(int *)((long)&(pnVar5->m_backend).data + lVar19 + -8);
        local_e8.neg = *(bool *)((long)&(pnVar5->m_backend).data + lVar19 + -4);
        local_e8._48_8_ = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19);
        if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_e8,&local_128), iVar13 < 0)) {
          DVar16 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((this->
                                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thesolver,(int)lVar21 + -1);
          uVar20 = (ulong)DVar16 >> 0x20;
          pnVar5 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + -0x10);
          local_128.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x30);
          local_128.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_128.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x20);
          local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar6 = *(undefined8 *)(puVar1 + 2);
          local_128.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_128.exp = *(int *)((long)&(pnVar5->m_backend).data + lVar19 + -8);
          local_128.neg = *(bool *)((long)&(pnVar5->m_backend).data + lVar19 + -4);
          local_128._48_8_ = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19);
        }
        lVar19 = lVar19 + -0x38;
        bVar7 = 1 < lVar21;
        lVar21 = lVar21 + -1;
      } while (bVar7);
    }
    lVar21 = (long)(((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->thevectors->set).thenum;
    if (0 < lVar21) {
      lVar19 = lVar21 * 0x38 + -8;
      do {
        pnVar5 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + -0x10);
        local_e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x30);
        local_e8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x20);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        local_e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_e8.exp = *(int *)((long)&(pnVar5->m_backend).data + lVar19 + -8);
        local_e8.neg = *(bool *)((long)&(pnVar5->m_backend).data + lVar19 + -4);
        local_e8._48_8_ = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19);
        if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_e8,&local_128), iVar13 < 0)) {
          DVar16 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::id((this->
                                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thesolver,(int)lVar21 + -1);
          uVar20 = (ulong)DVar16 >> 0x20;
          pnVar5 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->theTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + -0x10);
          local_128.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x30);
          local_128.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_128.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar19 + -0x20);
          local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar6 = *(undefined8 *)(puVar1 + 2);
          local_128.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_128.exp = *(int *)((long)&(pnVar5->m_backend).data + lVar19 + -8);
          local_128.neg = *(bool *)((long)&(pnVar5->m_backend).data + lVar19 + -4);
          local_128._48_8_ = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19);
        }
        lVar19 = lVar19 + -0x38;
        bVar7 = 1 < lVar21;
        lVar21 = lVar21 + -1;
      } while (bVar7);
    }
  }
  return (SPxId)((ulong)DVar16 & 0xffffffff | uVar20 << 0x20);
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}